

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::Noelse::dfs(Noelse *this,TreeNode *treeNode,SDTNode *fa)

{
  value_type vVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  bool bVar3;
  int iVar4;
  Loc *pLVar5;
  Bool *pBVar6;
  reference pvVar7;
  reference pvVar8;
  string *t1;
  Noelse *pNVar9;
  reference piVar10;
  Decls *this_00;
  Stmts *pSVar11;
  vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_> *this_01;
  Stmts *local_348;
  Stmts *local_340;
  Stmts *local_338;
  Stmts *stmts;
  Decls *decls;
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [36];
  int local_28c;
  iterator iStack_288;
  int t_2;
  iterator __end7;
  iterator __begin7;
  vector<int,_std::allocator<int>_> *__range7;
  Bool *local_268;
  Bool *local_260;
  Bool *bool_1_2;
  Stmt *stmt_1;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [36];
  int local_1b4;
  iterator iStack_1b0;
  int t_1;
  iterator __end6;
  iterator __begin6;
  vector<int,_std::allocator<int>_> *__range6;
  Noelse *local_190;
  Noelse *local_188;
  Noelse *noelse_1_1;
  Bool *bool_1_1;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [36];
  int local_dc;
  iterator iStack_d8;
  int t;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  Noelse *local_b8;
  Noelse *local_b0;
  Noelse *noelse_1;
  Bool *bool_1;
  string local_98 [39];
  allocator local_71;
  string local_70 [32];
  Bool *local_50;
  Loc *local_48;
  Bool *local_40;
  Bool *bool1;
  Loc *local_28;
  Loc *loc1;
  SDTNode *fa_local;
  TreeNode *treeNode_local;
  Noelse *this_local;
  
  loc1 = (Loc *)fa;
  fa_local = (SDTNode *)treeNode;
  treeNode_local = (TreeNode *)this;
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(&treeNode->sons);
  if (!bVar3) {
    if (*(int *)((long)&fa_local[2].sons.
                        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) == 0) {
      commonCal((TreeNode *)fa_local,&loc1->super_SDTNode,&this->super_SDTNode,&this->code);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 1) {
      pLVar5 = (Loc *)operator_new(0x88);
      Loc::Loc(pLVar5);
      local_28 = pLVar5;
      pBVar6 = (Bool *)operator_new(0x78);
      Bool::Bool(pBVar6);
      this_01 = &(this->super_SDTNode).sons;
      local_48 = local_28;
      local_40 = pBVar6;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (this_01,(value_type *)&local_48);
      local_50 = local_40;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (this_01,(value_type *)&local_50);
      pLVar5 = local_28;
      isl = 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,0);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pLVar5->super_SDTNode)._vptr_SDTNode)(pLVar5,pvVar8,this);
      pBVar6 = local_40;
      inAss = 1;
      inEval = 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,2);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pBVar6->super_SDTNode)._vptr_SDTNode)(pBVar6,pvVar8,this);
      inAss = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"=",&local_71);
      t1 = &local_40->addr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"_",(allocator *)((long)&bool_1 + 7));
      gen((string *)local_70,t1,(string *)local_98,&local_28->addr);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bool_1 + 7));
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 2) {
      pBVar6 = (Bool *)operator_new(0x78);
      Bool::Bool(pBVar6);
      noelse_1 = (Noelse *)pBVar6;
      pNVar9 = (Noelse *)operator_new(0x48);
      Noelse(pNVar9);
      local_b8 = noelse_1;
      local_b0 = pNVar9;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_b8);
      __range5 = (vector<int,_std::allocator<int>_> *)local_b0;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&__range5);
      inEval = 0;
      iVar4 = newLabel();
      pNVar9 = noelse_1;
      *(int *)&noelse_1[1].super_SDTNode.sons.
               super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage = iVar4;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,2);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pNVar9->super_SDTNode)._vptr_SDTNode)(pNVar9,pvVar8,this);
      writeLabel(*(int *)&noelse_1[1].super_SDTNode.sons.
                          super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar2 = *(vector<int,_std::allocator<int>_> **)&noelse_1[1].field_0x28;
      __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
      iStack_d8 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
      while (bVar3 = __gnu_cxx::operator!=(&__end5,&stack0xffffffffffffff28), bVar3) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end5);
        local_dc = *piVar10;
        writeLabel(local_dc);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end5);
      }
      pvVar2 = *(vector<int,_std::allocator<int>_> **)&noelse_1[1].field_0x28;
      if (pvVar2 != (vector<int,_std::allocator<int>_> *)0x0) {
        std::vector<int,_std::allocator<int>_>::~vector(pvVar2);
        operator_delete(pvVar2,0x18);
      }
      local_b0->gotoNext = this->gotoNext;
      iVar4 = newLabel();
      pNVar9 = local_b0;
      local_b0->gotoBegin = iVar4;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,4);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pNVar9->super_SDTNode)._vptr_SDTNode)(pNVar9,pvVar8,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"j",&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"_",&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"_",&local_151);
      std::__cxx11::to_string((__cxx11 *)&bool_1_1,local_b0->gotoBegin);
      gen((string *)local_100,(string *)local_128,(string *)local_150,(string *)&bool_1_1);
      std::__cxx11::string::~string((string *)&bool_1_1);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      writeLabel(*(int *)&noelse_1[1].field_0x24);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 3) {
      pBVar6 = (Bool *)operator_new(0x78);
      Bool::Bool(pBVar6);
      noelse_1_1 = (Noelse *)pBVar6;
      pNVar9 = (Noelse *)operator_new(0x48);
      Noelse(pNVar9);
      local_190 = noelse_1_1;
      local_188 = pNVar9;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_190);
      __range6 = (vector<int,_std::allocator<int>_> *)local_188;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&__range6);
      iVar4 = newLabel();
      this->gotoBegin = iVar4;
      writeLabel(this->gotoBegin);
      inEval = 0;
      iVar4 = newLabel();
      pNVar9 = noelse_1_1;
      *(int *)&noelse_1_1[1].super_SDTNode.sons.
               super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage = iVar4;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,2);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pNVar9->super_SDTNode)._vptr_SDTNode)(pNVar9,pvVar8,this);
      writeLabel(*(int *)&noelse_1_1[1].super_SDTNode.sons.
                          super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar2 = *(vector<int,_std::allocator<int>_> **)&noelse_1_1[1].field_0x28;
      __end6 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
      iStack_1b0 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
      while (bVar3 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffe50), bVar3) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end6);
        local_1b4 = *piVar10;
        writeLabel(local_1b4);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end6);
      }
      iVar4 = newLabel();
      pNVar9 = local_188;
      local_188->gotoNext = iVar4;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,4);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pNVar9->super_SDTNode)._vptr_SDTNode)(pNVar9,pvVar8,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"j",&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"_",&local_201);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"_",&local_229);
      std::__cxx11::to_string((__cxx11 *)&stmt_1,this->gotoBegin);
      gen((string *)local_1d8,(string *)local_200,(string *)local_228,(string *)&stmt_1);
      std::__cxx11::string::~string((string *)&stmt_1);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      writeLabel(local_188->gotoNext);
      writeLabel(*(int *)&noelse_1_1[1].field_0x24);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 4) {
      pBVar6 = (Bool *)operator_new(0x48);
      Stmt::Stmt((Stmt *)pBVar6);
      bool_1_2 = pBVar6;
      pBVar6 = (Bool *)operator_new(0x78);
      Bool::Bool(pBVar6);
      local_268 = bool_1_2;
      local_260 = pBVar6;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_268);
      __range7 = (vector<int,_std::allocator<int>_> *)local_260;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&__range7);
      iVar4 = newLabel();
      this->gotoBegin = iVar4;
      writeLabel(this->gotoBegin);
      iVar4 = newLabel();
      local_260->gotoTrue = iVar4;
      writeLabel(local_260->gotoTrue);
      pBVar6 = bool_1_2;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,1);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pBVar6->super_SDTNode)._vptr_SDTNode)(pBVar6,pvVar8,this);
      iVar4 = newLabel();
      pBVar6 = local_260;
      *(int *)&bool_1_2->addr = iVar4;
      inEval = 0;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,4);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pBVar6->super_SDTNode)._vptr_SDTNode)(pBVar6,pvVar8,this);
      pvVar2 = local_260->list;
      __end7 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
      iStack_288 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
      while (bVar3 = __gnu_cxx::operator!=(&__end7,&stack0xfffffffffffffd78), bVar3) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end7);
        local_28c = *piVar10;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)tempLabel,(long)-this->gotoBegin);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)tempLabel,(long)-local_28c);
        *pvVar7 = vVar1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end7);
      }
      writeLabel(*(int *)&bool_1_2->addr);
      writeLabel(local_260->orLast);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"j",&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"_",&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"_",&local_301);
      std::__cxx11::to_string((__cxx11 *)&decls,this->gotoNext);
      gen((string *)local_2b0,(string *)local_2d8,(string *)local_300,(string *)&decls);
      std::__cxx11::string::~string((string *)&decls);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 6) {
      this_00 = (Decls *)operator_new(0x68);
      Decls::Decls(this_00);
      stmts = (Stmts *)this_00;
      pSVar11 = (Stmts *)operator_new(0x48);
      Stmts::Stmts(pSVar11);
      local_340 = stmts;
      local_338 = pSVar11;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_340);
      local_348 = local_338;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_348);
      pSVar11 = stmts;
      local_338->gotoNext = this->gotoNext;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,1);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pSVar11->super_SDTNode)._vptr_SDTNode)(pSVar11,pvVar8,this);
      pSVar11 = local_338;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,2);
      pvVar8 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar7);
      (**(pSVar11->super_SDTNode)._vptr_SDTNode)(pSVar11,pvVar8,this);
    }
  }
  return;
}

Assistant:

virtual void dfs(TreeNode &treeNode,SDTNode *fa) {
            if (treeNode.sons.empty()) return;
            if(treeNode.opt==0){
                commonCal(treeNode,fa,this,code);
            }else if(treeNode.opt==1){
                Loc *loc1 = new Loc;
                Bool *bool1 = new Bool;
                sons.push_back(loc1);
                sons.push_back(bool1);
                isl=true;
                loc1->dfs(SON(0));
                inAss=true;
                inEval=true;
                bool1->dfs(SON(2));
                inAss=false;
                gen("=",bool1->addr,"_",loc1->addr);
            }else if(treeNode.opt==2){
                Bool *bool_1 = new Bool;
                Noelse *noelse_1 = new Noelse;
                sons.push_back(bool_1);
                sons.push_back(noelse_1);
                inEval = false;
                bool_1->gotoTrue = newLabel();
                bool_1->dfs(SON(2));
                writeLabel(bool_1->gotoTrue);
                for(auto t:(*bool_1->list)){
                    writeLabel(t);
                }
                delete bool_1->list;
                noelse_1->gotoNext = gotoNext;
                noelse_1->gotoBegin = newLabel();
                noelse_1->dfs(SON(4));
                gen("j","_","_",to_string(noelse_1->gotoBegin));
                writeLabel(bool_1->orLast);
            }else if(treeNode.opt==3){
                Bool *bool_1 = new Bool;
                Noelse *noelse_1 = new Noelse;
                sons.push_back(bool_1);
                sons.push_back(noelse_1);
                gotoBegin = newLabel();
                writeLabel(gotoBegin);
                inEval=false;
                bool_1->gotoTrue = newLabel();
                bool_1->dfs(SON(2));
                writeLabel(bool_1->gotoTrue);
                for(auto t:(*bool_1->list)){
                    writeLabel(t);
                }
                noelse_1->gotoNext = newLabel();
                noelse_1->dfs(SON(4));
                gen("j","_","_",to_string(gotoBegin));
                writeLabel(noelse_1->gotoNext);
                writeLabel(bool_1->orLast);
            }else if(treeNode.opt==4){
                Stmt *stmt_1 = new Stmt;
                Bool *bool_1 = new Bool;
                sons.push_back(stmt_1);
                sons.push_back(bool_1);
                gotoBegin = newLabel();
                writeLabel(gotoBegin);
                bool_1->gotoTrue = newLabel();
                writeLabel(bool_1->gotoTrue);
                stmt_1->dfs(SON(1));
                stmt_1->gotoNext = newLabel();
                inEval=false;
                bool_1->dfs(SON(4));
                for(auto t:(*bool_1->list)){
                    tempLabel[-t] = tempLabel[-gotoBegin];
                }
                writeLabel(stmt_1->gotoNext);
                writeLabel(bool_1->orLast);
            }else if(treeNode.opt==5){
                gen("j","_","_",to_string(gotoNext));
            }else if(treeNode.opt==6){
                Decls *decls = new Decls;
                Stmts *stmts = new Stmts;
                sons.push_back(decls);
                sons.push_back(stmts);
                stmts->gotoNext = gotoNext;
                decls->dfs(SON(1));
                stmts->dfs(SON(2));
            }
        }